

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O3

void __thiscall
ST::string::_set_utf8(string *this,char *utf8,size_t size,utf_validation_t validation)

{
  ulong uVar1;
  char *pcVar2;
  undefined8 extraout_RAX;
  char_buffer local_48;
  
  if (0xfffffff < size) {
    _set_utf8();
    if ((0xf < local_48.m_size) && (local_48.m_chars != (char *)0x0)) {
      operator_delete__(local_48.m_chars);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (utf8 == (char *)0x0) {
    local_48.m_data[0] = '\0';
    local_48.m_data[1] = '\0';
    local_48.m_data[2] = '\0';
    local_48.m_data[3] = '\0';
    local_48.m_data[4] = '\0';
    local_48.m_data[5] = '\0';
    local_48.m_data[6] = '\0';
    local_48.m_data[7] = '\0';
    local_48.m_data[8] = '\0';
    local_48.m_data[9] = '\0';
    local_48.m_data[10] = '\0';
    local_48.m_data[0xb] = '\0';
    local_48.m_data[0xc] = '\0';
    local_48.m_data[0xd] = '\0';
    local_48.m_data[0xe] = '\0';
    local_48.m_data[0xf] = '\0';
    pcVar2 = (this->m_buffer).m_chars;
    uVar1 = (this->m_buffer).m_size;
    (this->m_buffer).m_size = 0;
    (this->m_buffer).m_data[0] = '\0';
    (this->m_buffer).m_data[1] = '\0';
    (this->m_buffer).m_data[2] = '\0';
    (this->m_buffer).m_data[3] = '\0';
    (this->m_buffer).m_data[4] = '\0';
    (this->m_buffer).m_data[5] = '\0';
    (this->m_buffer).m_data[6] = '\0';
    (this->m_buffer).m_data[7] = '\0';
    (this->m_buffer).m_data[8] = '\0';
    (this->m_buffer).m_data[9] = '\0';
    (this->m_buffer).m_data[10] = '\0';
    (this->m_buffer).m_data[0xb] = '\0';
    (this->m_buffer).m_data[0xc] = '\0';
    (this->m_buffer).m_data[0xd] = '\0';
    (this->m_buffer).m_data[0xe] = '\0';
    (this->m_buffer).m_data[0xf] = '\0';
    (this->m_buffer).m_chars = (this->m_buffer).m_data;
    if (pcVar2 == (char *)0x0 || uVar1 < 0x10) {
      return;
    }
    goto LAB_0018d4ea;
  }
  local_48.m_data[0] = '\0';
  local_48.m_data[1] = '\0';
  local_48.m_data[2] = '\0';
  local_48.m_data[3] = '\0';
  local_48.m_data[4] = '\0';
  local_48.m_data[5] = '\0';
  local_48.m_data[6] = '\0';
  local_48.m_data[7] = '\0';
  local_48.m_data[8] = '\0';
  local_48.m_data[9] = '\0';
  local_48.m_data[10] = '\0';
  local_48.m_data[0xb] = '\0';
  local_48.m_data[0xc] = '\0';
  local_48.m_data[0xd] = '\0';
  local_48.m_data[0xe] = '\0';
  local_48.m_data[0xf] = '\0';
  local_48.m_size = size;
  if (size < 0x10) {
    pcVar2 = local_48.m_data;
    local_48.m_chars = pcVar2;
    if (size != 0) goto LAB_0018d4b9;
  }
  else {
    pcVar2 = (char *)operator_new__(size + 1);
LAB_0018d4b9:
    local_48.m_chars = pcVar2;
    memcpy(pcVar2,utf8,size);
  }
  pcVar2[size] = '\0';
  set(this,&local_48,validation);
  if (local_48.m_size < 0x10) {
    return;
  }
  pcVar2 = local_48.m_chars;
  if (local_48.m_chars == (char *)0x0) {
    return;
  }
LAB_0018d4ea:
  operator_delete__(pcVar2);
  return;
}

Assistant:

void _set_utf8(const char *utf8, size_t size, utf_validation_t validation)
        {
            ST_ASSERT(size < ST_HUGE_BUFFER_SIZE, "String data buffer is too large");

            if (!utf8) {
                m_buffer = char_buffer();
                return;
            }

            set(char_buffer(utf8, size), validation);
        }